

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Field.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,FieldDeclarationSymbol *fld)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  
  if (fld != (FieldDeclarationSymbol *)0x0) {
    std::operator<<(os,"<Field |");
    poVar1 = std::operator<<(os," name:");
    this = &MemberDeclarationSymbol::name(&fld->super_MemberDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<(os," type:");
    ty = MemberDeclarationSymbol::type(&fld->super_MemberDeclarationSymbol);
    operator<<(poVar1,ty);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<Field is null>");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FieldDeclarationSymbol* fld)
{
    if (!fld)
        return os << "<Field is null>";
    os << "<Field |";
    os << " name:" << fld->name()->valueText();
    os << " type:" << fld->type();
    os << ">";
    return os;
}